

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteTest.h
# Opt level: O1

void UnitTest::
     ExecuteTest<(anonymous_namespace)::TestRunnerFixtureFailureCountIsZeroWhenNoTestsAreRunHelper>
               (TestRunnerFixtureFailureCountIsZeroWhenNoTestsAreRunHelper *testObject,
               TestDetails *details)

{
  TestResults *pTVar1;
  int iVar2;
  TestDetails **ppTVar3;
  TestResults **ppTVar4;
  undefined8 *puVar5;
  SignalTranslator sig;
  int local_4bc;
  True local_4b5;
  int local_4b4;
  TestDetails local_4b0;
  SignalTranslator local_490;
  
  ppTVar3 = CurrentTest::Details();
  *ppTVar3 = details;
  SignalTranslator::SignalTranslator(&local_490);
  iVar2 = __sigsetjmp(SignalTranslator::s_jumpTarget,1);
  if (iVar2 == 0) {
    ppTVar4 = CurrentTest::Results();
    pTVar1 = *ppTVar4;
    local_4bc = 0;
    local_4b4 = TestRunner::RunTestsIf<UnitTest::True>
                          (&(testObject->super_TestRunnerFixture).runner,
                           &(testObject->super_TestRunnerFixture).list,(char *)0x0,&local_4b5,0);
    ppTVar3 = CurrentTest::Details();
    TestDetails::TestDetails(&local_4b0,*ppTVar3,0x5d);
    CheckEqual<int,int>(pTVar1,&local_4bc,&local_4b4,&local_4b0);
    ppTVar4 = CurrentTest::Results();
    pTVar1 = *ppTVar4;
    local_4bc = 0;
    ppTVar3 = CurrentTest::Details();
    TestDetails::TestDetails(&local_4b0,*ppTVar3,0x5e);
    CheckEqual<int,int>(pTVar1,&local_4bc,
                        &(testObject->super_TestRunnerFixture).reporter.testRunCount,&local_4b0);
    ppTVar4 = CurrentTest::Results();
    pTVar1 = *ppTVar4;
    local_4bc = 0;
    ppTVar3 = CurrentTest::Details();
    TestDetails::TestDetails(&local_4b0,*ppTVar3,0x5f);
    CheckEqual<int,int>(pTVar1,&local_4bc,
                        &(testObject->super_TestRunnerFixture).reporter.testFailedCount,&local_4b0);
    SignalTranslator::~SignalTranslator(&local_490);
    return;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = "Unhandled system exception";
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

void ExecuteTest(T& testObject, TestDetails const& details)
{
	CurrentTest::Details() = &details;

	try
	{
#ifdef UNITTEST_POSIX
		UNITTEST_THROW_SIGNALS
#endif
		testObject.RunImpl();
	}
	catch (AssertException const& e)
	{
		CurrentTest::Results()->OnTestFailure(
			TestDetails(details.testName, details.suiteName, e.Filename(), e.LineNumber()), e.what());
	}
	catch (std::exception const& e)
	{
		MemoryOutStream stream;
		stream << "Unhandled exception: " << e.what();
		CurrentTest::Results()->OnTestFailure(details, stream.GetText());
	}
	catch (...)
	{
		CurrentTest::Results()->OnTestFailure(details, "Unhandled exception: Crash!");
	}
}